

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::assessPossiblyDualUnbounded(HEkkDual *this)

{
  bool bVar1;
  long in_RDI;
  bool proof_of_infeasibility;
  bool in_stack_0000002f;
  BadBasisChangeReason in_stack_00000030;
  HighsInt in_stack_00000034;
  HighsInt in_stack_00000038;
  HighsInt in_stack_0000003c;
  HEkk *in_stack_00000040;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((*(int *)(in_RDI + 0xe4) == 2) && ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x255a) & 1) != 0)) {
    bVar1 = proofOfPrimalInfeasibility((HEkkDual *)0x787d3c);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0xe4) = 0xfffffffe;
      saveDualRay((HEkkDual *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x2970) = 8;
    }
    else {
      HEkk::addBadBasisChange
                (in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                 in_stack_00000030,in_stack_0000002f);
      *(undefined4 *)(in_RDI + 0xe8) = 0;
    }
  }
  return;
}

Assistant:

void HEkkDual::assessPossiblyDualUnbounded() {
  assert(rebuild_reason == kRebuildReasonPossiblyDualUnbounded);
  if (solve_phase != kSolvePhase2) return;
  if (!ekk_instance_.status_.has_fresh_rebuild) return;
  // Appears to be dual unbounded in phase 2 after fresh
  // rebuild. Normally this implies primal infeasibility, but only
  // allow this to be claimed if the proof of primal infeasibility
  // is true.
  //
  const bool proof_of_infeasibility = proofOfPrimalInfeasibility();
  if (proof_of_infeasibility) {
    // There is a proof of primal infeasibility
    solve_phase = kSolvePhaseExit;
    // Save dual ray information
    saveDualRay();
    // Model status should be unset?
    assert(ekk_instance_.model_status_ == HighsModelStatus::kNotset);
    ekk_instance_.model_status_ = HighsModelStatus::kInfeasible;
  } else {
    // No proof of primal infeasibility, so assume dual unbounded
    // claim is spurious. Make row_out taboo, and prevent rebuild
    ekk_instance_.addBadBasisChange(
        row_out, variable_out, variable_in,
        BadBasisChangeReason::kFailedInfeasibilityProof, true);
    rebuild_reason = kRebuildReasonNo;
  }
}